

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::_::
CopyConstructArray_<capnp::compiler::CompilerMain::OutputDirective,_capnp::compiler::CompilerMain::OutputDirective_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  OutputDirective *pOVar1;
  
  while (pOVar1 = this->pos, this->start < pOVar1) {
    this->pos = pOVar1 + -1;
    NullableValue<kj::Path>::~NullableValue(&pOVar1[-1].dir.ptr);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }